

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O0

UINT8 device_start_upd7759(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  upd7759_state *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0xa8);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT8 *)&((DEV_DATA *)((long)devData.chipInf + 0x60))->chipInf = cfg->flags;
    *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = 1;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x10))->chipInf = 0x400000;
    *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 0x20))->chipInf = 0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x58))->chipInf = 0;
    *(undefined4 *)((long)devData.chipInf + 0x44) = 0;
    ((DEV_DATA *)((long)devData.chipInf + 0x50))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x48))->chipInf = (void *)0x0;
    if (*(char *)&((DEV_DATA *)((long)devData.chipInf + 0x60))->chipInf != '\0') {
      *(undefined4 *)((long)devData.chipInf + 0x5c) = 0;
    }
    ((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf = (void *)0x0;
    *(undefined1 *)((long)devData.chipInf + 0x15) = 1;
    *(undefined1 *)((long)devData.chipInf + 0x16) = 1;
    upd7759_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,cfg->clock >> 2,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_upd7759(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	upd7759_state *chip;

	chip = (upd7759_state *)calloc(1, sizeof(upd7759_state));
	if (chip == NULL)
		return 0xFF;

	chip->ChipMode = cfg->flags;

	/* chip configuration */
	//chip->sample_offset_shift = (type() == UPD7759) ? 1 : 0;
	chip->sample_offset_shift = 1;

	/* compute the stepping rate based on the chip's clock speed */
	chip->step = 4 * FRAC_ONE;

	/* compute the clock period */
	//chip->clock_period = attotime::from_hz(clock());

	/* set the intial state */
	chip->state = STATE_IDLE;

	/* compute the ROM base or allocate a timer */
	chip->romoffset = 0x00;
	chip->romsize = 0x00;
	chip->rom = chip->rombase = NULL;
	if (chip->ChipMode)
	{
		//assert(type() == UPD7759); // other chips do not support slave mode
		//chip->timer = timer_alloc(TIMER_SLAVE_UPDATE);
		chip->rommask = 0;
	}

	/* set the DRQ callback */
	chip->drqcallback = NULL;

	/* assume /RESET and /START are both high */
	chip->reset = 1;
	chip->start = 1;

	/* toggle the reset line to finish the reset */
	//upd7759_reset(chip);

	upd7759_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, cfg->clock / 4, &devDef);
	return 0x00;
}